

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitTableInit(PrintExpressionContents *this,TableInit *curr)

{
  string_view str;
  
  str._M_str = "table.init ";
  str._M_len = 0xb;
  printMedium(this->o,str);
  Name::print(&curr->table,this->o);
  std::operator<<(this->o,' ');
  Name::print(&curr->segment,this->o);
  return;
}

Assistant:

void visitTableInit(TableInit* curr) {
    printMedium(o, "table.init ");
    curr->table.print(o);
    o << ' ';
    curr->segment.print(o);
  }